

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_eaf21::preprocessor<baryonyx::raw_problem>::affects
          (preprocessor<baryonyx::raw_problem> *this)

{
  pp_lifo *this_00;
  int iVar1;
  pointer ppVar2;
  int *piVar3;
  pointer piVar4;
  pp_variable_value pVar5;
  int iVar6;
  int *piVar7;
  tuple<int,_bool> v;
  pp_variable_value top;
  bool local_48 [4];
  int local_44;
  int local_40;
  bool local_3c [4];
  _Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_38;
  
  local_38 = (_Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->vars;
  this_00 = &this->lifo;
  while ((this->lifo).data.
         super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->lifo).data.
         super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    pVar5 = pp_lifo::pop(this_00);
    local_40 = pVar5.index;
    local_3c[0] = pVar5.value;
    std::
    _Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<int&,bool&>(local_38,&local_40,local_3c);
    baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>,bool>
              (this->ctx,"    - variable {} assigned to {}.\n",
               (this->pb->vars).names.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_40,local_3c);
    ppVar2 = (this->cache).
             super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = *(pointer *)
              ((long)&ppVar2[local_40].in_equal_constraints.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar7 = *(int **)&ppVar2[local_40].in_equal_constraints.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl; piVar7 != piVar3;
        piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      piVar4 = (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar4[iVar1];
      if ((0 < iVar6) && (iVar6 = iVar6 + -1, piVar4[iVar1] = iVar6, iVar6 == 1)) {
        baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                  (this->ctx,"      - equal constraint {} will be removed.\n",
                   &(this->pb->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1].label);
        reduce_equal_constraint((preprocessor<baryonyx::raw_problem> *)local_48,(constraint *)this);
        (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar1] = 0;
        if (-1 < local_44) {
          pp_lifo::emplace(this_00,local_44,local_48[0]);
        }
      }
    }
    ppVar2 = (this->cache).
             super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = *(pointer *)
              ((long)&ppVar2[local_40].in_greater_constraints.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar7 = ppVar2[local_40].in_greater_constraints.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      piVar4 = (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar4[iVar1];
      if ((0 < iVar6) && (iVar6 = iVar6 + -1, piVar4[iVar1] = iVar6, iVar6 == 1)) {
        baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                  (this->ctx,"      - greater constraint {} will be removed.\n",
                   &(this->pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1].label);
        reduce_greater_constraint
                  ((preprocessor<baryonyx::raw_problem> *)local_48,(constraint *)this);
        (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar1] = 0;
        if (-1 < local_44) {
          pp_lifo::emplace(this_00,local_44,local_48[0]);
        }
      }
    }
    ppVar2 = (this->cache).
             super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = *(pointer *)
              ((long)&ppVar2[local_40].in_less_constraints.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar7 = ppVar2[local_40].in_less_constraints.super__Vector_base<int,_std::allocator<int>_>
                  ._M_impl.super__Vector_impl_data._M_start; piVar7 != piVar3; piVar7 = piVar7 + 1)
    {
      iVar1 = *piVar7;
      piVar4 = (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar4[iVar1];
      if ((0 < iVar6) && (iVar6 = iVar6 + -1, piVar4[iVar1] = iVar6, iVar6 == 1)) {
        baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                  (this->ctx,"      - less constraint {} will be removed.\n",
                   &(this->pb->less_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1].label);
        reduce_less_constraint((preprocessor<baryonyx::raw_problem> *)local_48,(constraint *)this);
        (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar1] = 0;
        if (-1 < local_44) {
          pp_lifo::emplace(this_00,local_44,local_48[0]);
        }
      }
    }
  }
  return;
}

Assistant:

void affects()
    {
        while (!lifo.empty()) {
            auto top = lifo.pop();
            vars.emplace(top.index, top.value);

            debug(ctx,
                  "    - variable {} assigned to {}.\n",
                  pb.vars.names[top.index],
                  top.value);

            for (int cst : cache[top.index].in_equal_constraints) {
                if (equal_constraints[cst] <= 0)
                    continue;

                --equal_constraints[cst];

                if (equal_constraints[cst] == 1) {
                    debug(ctx,
                          "      - equal constraint {} will be removed.\n",
                          pb.equal_constraints[cst].label);

                    auto v =
                      reduce_equal_constraint(pb.equal_constraints[cst]);
                    equal_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }

            for (int cst : cache[top.index].in_greater_constraints) {
                if (greater_constraints[cst] <= 0)
                    continue;

                --greater_constraints[cst];

                if (greater_constraints[cst] == 1) {
                    debug(ctx,
                          "      - greater constraint {} will be removed.\n",
                          pb.greater_constraints[cst].label);

                    auto v =
                      reduce_greater_constraint(pb.greater_constraints[cst]);
                    greater_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }

            for (int cst : cache[top.index].in_less_constraints) {
                if (less_constraints[cst] <= 0)
                    continue;

                --less_constraints[cst];

                if (less_constraints[cst] == 1) {
                    debug(ctx,
                          "      - less constraint {} will be removed.\n",
                          pb.less_constraints[cst].label);

                    auto v = reduce_less_constraint(pb.less_constraints[cst]);
                    less_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }
        }
    }